

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O1

Move * ddSymmSiftingUp(DdManager *table,int y,int xLow)

{
  int y_00;
  uint uVar1;
  DdHalfWord DVar2;
  DdSubtable *pDVar3;
  int iVar4;
  DdHalfWord DVar5;
  int iVar6;
  DdHalfWord DVar7;
  int iVar8;
  DdNode *pDVar9;
  DdNode *pDVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  int local_50;
  DdNode *local_40;
  DdHalfWord local_38;
  DdHalfWord local_34;
  
  local_40 = (DdNode *)0x0;
  y_00 = table->invperm[y];
  uVar1 = y;
  do {
    uVar11 = uVar1;
    uVar1 = table->subtables[(int)uVar11].next;
  } while (uVar11 < uVar1);
  iVar12 = table->keys - table->isolated;
  local_50 = iVar12;
  if (xLow < (int)uVar11) {
    lVar14 = (long)xLow;
    lVar13 = lVar14 * 0xe + 0x12;
    do {
      iVar6 = table->invperm[lVar14 + 1];
      if ((iVar6 == y_00) || (iVar4 = cuddTestInteract(table,iVar6,y_00), iVar4 != 0)) {
        local_50 = (local_50 + (uint)(table->vars[iVar6]->ref == 1)) -
                   *(int *)((long)&table->subtables->nodelist + lVar13 * 4);
      }
      lVar14 = lVar14 + 1;
      lVar13 = lVar13 + 0xe;
    } while ((int)uVar11 != lVar14);
  }
  DVar5 = cuddNextLow(table,y);
  do {
    if ((int)DVar5 < xLow) {
      return (Move *)local_40;
    }
    if (iVar12 < local_50) {
      return (Move *)local_40;
    }
    pDVar3 = table->subtables;
    DVar2 = pDVar3[(int)DVar5].next;
    local_34 = DVar5;
    iVar6 = cuddSymmCheck(table,DVar5,y);
    DVar7 = local_34;
    if (iVar6 == 0) {
      local_38 = DVar2;
      if ((DVar2 == local_34) && (pDVar3[y].next == y)) {
        iVar6 = table->invperm[(int)DVar5];
        iVar4 = cuddSwapInPlace(table,local_34,y);
        if (iVar4 == 0) {
LAB_00918daf:
          if (local_40 != (DdNode *)0x0) {
            pDVar9 = table->nextFree;
            do {
              pDVar10 = local_40;
              local_40 = (pDVar10->type).kids.T;
              pDVar10->ref = 0;
              pDVar10->next = pDVar9;
              pDVar9 = pDVar10;
            } while (local_40 != (DdNode *)0x0);
            table->nextFree = pDVar10;
          }
          return (Move *)0x1;
        }
        iVar8 = cuddTestInteract(table,iVar6,y_00);
        if (iVar8 != 0) {
          local_50 = (local_50 - (uint)(table->vars[iVar6]->ref == 1)) + table->subtables[y].keys;
        }
        pDVar9 = cuddDynamicAllocNode(table);
        if (pDVar9 == (DdNode *)0x0) goto LAB_00918daf;
        pDVar9->index = DVar7;
        pDVar9->ref = y;
        *(int *)((long)&pDVar9->next + 4) = iVar4;
        (pDVar9->type).kids.T = local_40;
        if ((double)iVar12 * table->maxGrowth < (double)iVar4) {
          return (Move *)pDVar9;
        }
        y = local_38;
        local_40 = pDVar9;
        if (iVar4 < iVar12) {
          iVar12 = iVar4;
        }
      }
      else {
        iVar6 = ddSymmGroupMove(table,local_34,y,(Move **)&local_40);
        pDVar9 = local_40;
        if (iVar6 == 0) goto LAB_00918daf;
        DVar5 = local_40->ref;
        do {
          iVar4 = table->invperm[(int)DVar5];
          iVar8 = cuddTestInteract(table,iVar4,y_00);
          if (iVar8 != 0) {
            local_50 = (local_50 - (uint)(table->vars[iVar4]->ref == 1)) +
                       table->subtables[(int)DVar5].keys;
          }
          DVar5 = table->subtables[(int)DVar5].next;
        } while (DVar5 != pDVar9->ref);
        if ((double)iVar12 * table->maxGrowth < (double)iVar6) {
          return (Move *)pDVar9;
        }
        y = local_38;
        if (iVar6 < iVar12) {
          iVar12 = iVar6;
        }
      }
    }
    else {
      pDVar3[(int)DVar5].next = y;
      DVar5 = pDVar3[y].next;
      do {
        DVar7 = DVar5;
        DVar5 = pDVar3[(int)DVar7].next;
      } while (pDVar3[(int)DVar7].next != y);
      pDVar3[(int)DVar7].next = DVar2;
      y = DVar2;
    }
    DVar5 = cuddNextLow(table,y);
  } while( true );
}

Assistant:

static Move *
ddSymmSiftingUp(
  DdManager * table,
  int  y,
  int  xLow)
{
    Move *moves;
    Move *move;
    int  x;
    int  size;
    int  i;
    int  gxtop,gybot;
    int  limitSize;
    int  xindex, yindex;
    int  zindex;
    int  z;
    int  isolated;
    int  L;     /* lower bound on DD size */
#ifdef DD_DEBUG
    int  checkL;
#endif


    moves = NULL;
    yindex = table->invperm[y];

    /* Initialize the lower bound.
    ** The part of the DD below the bottom of y' group will not change.
    ** The part of the DD above y that does not interact with y will not
    ** change. The rest may vanish in the best case, except for
    ** the nodes at level xLow, which will not vanish, regardless.
    */
    limitSize = L = table->keys - table->isolated;
    gybot = y;
    while ((unsigned) gybot < table->subtables[gybot].next)
        gybot = table->subtables[gybot].next;
    for (z = xLow + 1; z <= gybot; z++) {
        zindex = table->invperm[z];
        if (zindex == yindex || cuddTestInteract(table,zindex,yindex)) {
            isolated = table->vars[zindex]->ref == 1;
            L -= table->subtables[z].keys - isolated;
        }
    }

    x = cuddNextLow(table,y);
    while (x >= xLow && L <= limitSize) {
#ifdef DD_DEBUG
        gybot = y;
        while ((unsigned) gybot < table->subtables[gybot].next)
            gybot = table->subtables[gybot].next;
        checkL = table->keys - table->isolated;
        for (z = xLow + 1; z <= gybot; z++) {
            zindex = table->invperm[z];
            if (zindex == yindex || cuddTestInteract(table,zindex,yindex)) {
                isolated = table->vars[zindex]->ref == 1;
                checkL -= table->subtables[z].keys - isolated;
            }
        }
        assert(L == checkL);
#endif
        gxtop = table->subtables[x].next;
        if (cuddSymmCheck(table,x,y)) {
            /* Symmetry found, attach symm groups */
            table->subtables[x].next = y;
            i = table->subtables[y].next;
            while (table->subtables[i].next != (unsigned) y)
                i = table->subtables[i].next;
            table->subtables[i].next = gxtop;
        } else if (table->subtables[x].next == (unsigned) x &&
                   table->subtables[y].next == (unsigned) y) {
            /* x and y have self symmetry */
            xindex = table->invperm[x];
            size = cuddSwapInPlace(table,x,y);
#ifdef DD_DEBUG
            assert(table->subtables[x].next == (unsigned) x);
            assert(table->subtables[y].next == (unsigned) y);
#endif
            if (size == 0) goto ddSymmSiftingUpOutOfMem;
            /* Update the lower bound. */
            if (cuddTestInteract(table,xindex,yindex)) {
                isolated = table->vars[xindex]->ref == 1;
                L += table->subtables[y].keys - isolated;
            }
            move = (Move *) cuddDynamicAllocNode(table);
            if (move == NULL) goto ddSymmSiftingUpOutOfMem;
            move->x = x;
            move->y = y;
            move->size = size;
            move->next = moves;
            moves = move;
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(moves);
            if (size < limitSize) limitSize = size;
        } else { /* Group move */
            size = ddSymmGroupMove(table,x,y,&moves);
            if (size == 0) goto ddSymmSiftingUpOutOfMem;
            /* Update the lower bound. */
            z = moves->y;
            do {
                zindex = table->invperm[z];
                if (cuddTestInteract(table,zindex,yindex)) {
                    isolated = table->vars[zindex]->ref == 1;
                    L += table->subtables[z].keys - isolated;
                }
                z = table->subtables[z].next;
            } while (z != (int) moves->y);
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(moves);
            if (size < limitSize) limitSize = size;
        }
        y = gxtop;
        x = cuddNextLow(table,y);
    }

    return(moves);

ddSymmSiftingUpOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return(MV_OOM);

}